

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::msgpack::
basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::parse
          (basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this
          ,item_event_visitor *visitor,error_code *ec)

{
  pointer ppVar1;
  pointer ppVar2;
  assertion_error *this_00;
  allocator<char> local_41;
  string local_40;
  
switchD_0018d022_default:
  do {
    if (this->done_ != false) {
      return;
    }
    if (this->more_ != true) {
      return;
    }
    ppVar1 = (this->state_stack_).
             super__Vector_base<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    switch(ppVar1[-1].mode) {
    case root:
      ppVar1[-1].mode = accept;
      break;
    case accept:
      ppVar2 = (this->state_stack_).
               super__Vector_base<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)ppVar1 - (long)ppVar2 != 0x18) {
        this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"assertion \'state_stack_.size() == 1\' failed at  <> :0",
                   &local_41);
        assertion_error::assertion_error(this_00,&local_40);
        __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (ppVar1 != ppVar2) {
        (this->state_stack_).
        super__Vector_base<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
      }
      this->more_ = false;
      this->done_ = true;
      (*visitor->_vptr_basic_item_event_visitor[2])(visitor);
      goto switchD_0018d022_default;
    case array:
      if (ppVar1[-1].length <= ppVar1[-1].index) {
        end_array(this,visitor,ec);
        goto switchD_0018d022_default;
      }
      ppVar1[-1].index = ppVar1[-1].index + 1;
      break;
    case map_key:
      if (ppVar1[-1].length <= ppVar1[-1].index) {
        end_object(this,visitor,ec);
        goto switchD_0018d022_default;
      }
      ppVar1[-1].index = ppVar1[-1].index + 1;
      ppVar1[-1].mode = map_value;
      break;
    case map_value:
      ppVar1[-1].mode = map_key;
      break;
    default:
      goto switchD_0018d022_default;
    }
    read_item(this,visitor,ec);
    if (ec->_M_value != 0) {
      return;
    }
  } while( true );
}

Assistant:

void parse(item_event_visitor& visitor, std::error_code& ec)
    {
        while (!done_ && more_)
        {
            switch (state_stack_.back().mode)
            {
                case parse_mode::array:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        read_item(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                    }
                    else
                    {
                        end_array(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_key:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        state_stack_.back().mode = parse_mode::map_value;
                        read_item(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                    }
                    else
                    {
                        end_object(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_value:
                {
                    state_stack_.back().mode = parse_mode::map_key;
                    read_item(visitor, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    break;
                }
                case parse_mode::root:
                {
                    state_stack_.back().mode = parse_mode::accept;
                    read_item(visitor, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    break;
                }
                case parse_mode::accept:
                {
                    JSONCONS_ASSERT(state_stack_.size() == 1);
                    state_stack_.clear();
                    more_ = false;
                    done_ = true;
                    visitor.flush();
                    break;
                }
            }
        }
    }